

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *p,Vec_Int_t *vPivot,int fRemove,int fUpdate)

{
  long lVar1;
  Vec_Int_t *p_00;
  Vec_Flt_t *pVVar2;
  Vec_Que_t *p_01;
  uint v;
  int iVar3;
  float *pfVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  long local_48;
  
  iVar3 = 0;
  if (1 < vPivot->nSize) {
    iVar3 = vPivot->nSize;
    if (1 < iVar3) {
      local_48 = 2;
      lVar9 = 1;
      do {
        lVar1 = lVar9 + 1;
        if (lVar1 < vPivot->nSize) {
          iVar3 = vPivot->pArray[lVar9];
          lVar9 = local_48;
          do {
            iVar6 = vPivot->pArray[lVar9];
            if (iVar6 <= iVar3) {
              __assert_fail("Lit < Lit2",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                            ,0x317,
                            "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)");
            }
            p_00 = p->vCubeFree;
            p_00->nSize = 0;
            if ((iVar3 < 0) || (Vec_IntPush(p_00,iVar3 * 2 ^ 2), iVar6 < 0)) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf4,"int Abc_LitNot(int)");
            }
            Vec_IntPush(p->vCubeFree,iVar6 * 2 ^ 3);
            v = Hsh_VecManAdd(p->pHash,p->vCubeFree);
            if (fRemove == 0) {
              pVVar2 = p->vWeights;
              if (pVVar2->nSize == v) {
                lVar5 = (long)p->vCubeFree->nSize;
                if (lVar5 < 1) {
                  iVar6 = 0;
                }
                else {
                  lVar7 = 0;
                  iVar6 = 0;
                  do {
                    uVar8 = p->vCubeFree->pArray[lVar7];
                    if ((int)uVar8 < 0) {
                      __assert_fail("Lit >= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                    ,0xf2,"int Abc_Lit2Var(int)");
                    }
                    uVar8 = uVar8 >> 2;
                    if (p->vLevels->nSize <= (int)uVar8) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                    }
                    iVar10 = p->vLevels->pArray[uVar8];
                    if (iVar6 <= iVar10) {
                      iVar6 = iVar10;
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar5 != lVar7);
                }
                if (799 < iVar6) {
                  iVar6 = 800;
                }
                uVar8 = pVVar2->nCap;
                if (pVVar2->nSize == uVar8) {
                  if ((int)uVar8 < 0x10) {
                    if (pVVar2->pArray == (float *)0x0) {
                      pfVar4 = (float *)malloc(0x40);
                    }
                    else {
                      pfVar4 = (float *)realloc(pVVar2->pArray,0x40);
                    }
                    pVVar2->pArray = pfVar4;
                    iVar10 = 0x10;
                  }
                  else {
                    iVar10 = uVar8 * 2;
                    if (iVar10 <= (int)uVar8) goto LAB_00266185;
                    if (pVVar2->pArray == (float *)0x0) {
                      pfVar4 = (float *)malloc((ulong)uVar8 << 3);
                    }
                    else {
                      pfVar4 = (float *)realloc(pVVar2->pArray,(ulong)uVar8 << 3);
                    }
                    pVVar2->pArray = pfVar4;
                  }
                  pVVar2->nCap = iVar10;
                }
LAB_00266185:
                iVar10 = pVVar2->nSize;
                pVVar2->nSize = iVar10 + 1;
                pVVar2->pArray[iVar10] = (float)iVar6 * -0.001 + -1.1;
                p->nDivsS = p->nDivsS + 1;
              }
              pVVar2 = p->vWeights;
              if (pVVar2->nSize <= (int)v) {
                __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                              ,0x323,
                              "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)")
                ;
              }
              iVar6 = 1;
              fVar11 = 1.0;
            }
            else {
              pVVar2 = p->vWeights;
              if (pVVar2->nSize <= (int)v) {
                __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                              ,0x329,
                              "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)")
                ;
              }
              iVar6 = -1;
              fVar11 = -1.0;
            }
            if ((int)v < 0) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                            ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
            }
            pVVar2->pArray[v] = fVar11 + pVVar2->pArray[v];
            p->nPairsS = p->nPairsS + iVar6;
            if (fUpdate != 0) {
              if ((int)v < 0) {
                __assert_fail("v >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                              ,0xda,"int Vec_QueIsMember(Vec_Que_t *, int)");
              }
              p_01 = p->vPrio;
              if (((int)v < p_01->nCap) && (-1 < p_01->pOrder[v])) {
                Vec_QueUpdate(p_01,v);
              }
              else if (fRemove == 0) {
                Vec_QuePush(p_01,v);
              }
            }
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 < vPivot->nSize);
        }
        iVar3 = vPivot->nSize;
        local_48 = local_48 + 1;
        lVar9 = lVar1;
      } while (lVar1 < iVar3);
    }
    iVar3 = ((iVar3 + -1) * iVar3) / 2;
  }
  return iVar3;
}

Assistant:

int Fx_ManCubeSingleCubeDivisors( Fx_Man_t * p, Vec_Int_t * vPivot, int fRemove, int fUpdate )
{
    int k, n, Lit, Lit2, iDiv;
    if ( Vec_IntSize(vPivot) < 2 )
        return 0;
    Vec_IntForEachEntryStart( vPivot, Lit, k, 1 )
    Vec_IntForEachEntryStart( vPivot, Lit2, n, k+1 )
    {
        assert( Lit < Lit2 );
        Vec_IntClear( p->vCubeFree );
        Vec_IntPush( p->vCubeFree, Abc_Var2Lit(Abc_LitNot(Lit), 0) );
        Vec_IntPush( p->vCubeFree, Abc_Var2Lit(Abc_LitNot(Lit2), 1) );
        iDiv = Hsh_VecManAdd( p->pHash, p->vCubeFree );
        if ( !fRemove )
        {
            if ( Vec_FltSize(p->vWeights) == iDiv )
            {
                Vec_FltPush(p->vWeights, -2 + 0.9 - 0.001 * Fx_ManComputeLevelDiv(p, p->vCubeFree));
                p->nDivsS++;
            }
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, 1 );
            p->nPairsS++;
        }
        else
        {
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, -1 );
            p->nPairsS--;
        }
        if ( fUpdate )
        {
            if ( Vec_QueIsMember(p->vPrio, iDiv) )
                Vec_QueUpdate( p->vPrio, iDiv );
            else if ( !fRemove )
                Vec_QuePush( p->vPrio, iDiv );
        }
    }
    return Vec_IntSize(vPivot) * (Vec_IntSize(vPivot) - 1) / 2;
}